

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

DVector2 __thiscall AActor::Vec2Offset(AActor *this,double dx,double dy,bool absolute)

{
  double dVar1;
  int in_EDX;
  undefined7 in_register_00000031;
  double x;
  DVector2 DVar2;
  
  x = *(double *)(CONCAT71(in_register_00000031,absolute) + 0x48);
  if (in_EDX == 0) {
    DVar2 = P_GetOffsetPosition(x,*(double *)(CONCAT71(in_register_00000031,absolute) + 0x50),dx,dy)
    ;
    dy = DVar2.Y;
    x = DVar2.X;
  }
  else {
    dVar1 = *(double *)(CONCAT71(in_register_00000031,absolute) + 0x50);
    (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)(dx + x);
    (this->super_DThinker).super_DObject.Class = (PClass *)(dy + dVar1);
  }
  DVar2.Y = dy;
  DVar2.X = x;
  return DVar2;
}

Assistant:

DVector2 Vec2Offset(double dx, double dy, bool absolute = false)
	{
		if (absolute)
		{
			return { X() + dx, Y() + dy };
		}
		else
		{
			return P_GetOffsetPosition(X(), Y(), dx, dy);
		}
	}